

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O2

double GetMaxEigenval(QMatrix *A,PrecondProcType PrecondProc,double OmegaPrecond)

{
  LASErrIdType LVar1;
  void **ppvVar2;
  void *pvVar3;
  char *Object1Name;
  double dVar4;
  
  Q_Lock(A);
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return 1.0;
  }
  ppvVar2 = Q_EigenvalInfo(A);
  pvVar3 = *ppvVar2;
  if (pvVar3 == (void *)0x0) {
    pvVar3 = malloc(0x20);
    if (pvVar3 == (void *)0x0) {
      Object1Name = Q_GetName(A);
      pvVar3 = (void *)0x0;
      LASError(LASMemAllocErr,"GetMaxEigenval",Object1Name,(char *)0x0,(char *)0x0);
    }
    else {
      ppvVar2 = Q_EigenvalInfo(A);
      *ppvVar2 = pvVar3;
      EstimEigenvals(A,PrecondProc,OmegaPrecond);
    }
  }
  if (*(PrecondProcType *)((long)pvVar3 + 0x10) == PrecondProc) {
    if ((*(double *)((long)pvVar3 + 0x18) == OmegaPrecond) &&
       (!NAN(*(double *)((long)pvVar3 + 0x18)) && !NAN(OmegaPrecond))) goto LAB_0010f453;
  }
  EstimEigenvals(A,PrecondProc,OmegaPrecond);
LAB_0010f453:
  LVar1 = LASResult();
  dVar4 = 1.0;
  if (LVar1 == LASOK) {
    dVar4 = *(double *)((long)pvVar3 + 8);
  }
  return dVar4;
}

Assistant:

double GetMaxEigenval(QMatrix *A, PrecondProcType PrecondProc, double OmegaPrecond)
/* returns estimate for maximum eigenvalue of the matrix A */
{
    double MaxEigenval;

    EigenvalInfoType *EigenvalInfo;
    
    Q_Lock(A);
    
    if (LASResult() == LASOK) {
        EigenvalInfo = (EigenvalInfoType *)*(Q_EigenvalInfo(A));
        /* if eigenvalues not estimated yet, ... */
        if (EigenvalInfo == NULL) {
            EigenvalInfo = (EigenvalInfoType *)malloc(sizeof(EigenvalInfoType));
            if (EigenvalInfo != NULL) {
	        *(Q_EigenvalInfo(A)) = (void *)EigenvalInfo;
                EstimEigenvals(A, PrecondProc, OmegaPrecond);
            } else {
                LASError(LASMemAllocErr, "GetMaxEigenval", Q_GetName(A), NULL, NULL);
            }
        }
	
        /* if eigenvalues estimated with an other preconditioner, ... */
        if (EigenvalInfo->PrecondProcUsed != PrecondProc
	    || EigenvalInfo->OmegaPrecondUsed != OmegaPrecond) {
            EstimEigenvals(A, PrecondProc, OmegaPrecond);
        }

        if (LASResult() == LASOK)
            MaxEigenval = EigenvalInfo->MaxEigenval;
        else 
            MaxEigenval = 1.0;
    } else {
        MaxEigenval = 1.0;
    }
    
    return(MaxEigenval);             
}